

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

void uv__udp_recvmsg(uv_udp_t *handle)

{
  uv_udp_recv_cb p_Var1;
  int iVar2;
  int *piVar3;
  bool bVar4;
  uv_buf_t uVar5;
  char *local_f8;
  char *local_f0;
  int local_e8;
  uint local_e4;
  int count;
  int flags;
  uv_buf_t buf;
  ssize_t nread;
  msghdr h;
  sockaddr_storage peer;
  uv_udp_t *handle_local;
  
  if (handle->recv_cb == (uv_udp_recv_cb)0x0) {
    __assert_fail("handle->recv_cb != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/udp.c"
                  ,0xdc,"void uv__udp_recvmsg(uv_udp_t *)");
  }
  if (handle->alloc_cb != (uv_alloc_cb)0x0) {
    local_e8 = 0x20;
    do {
      uVar5 = uv_buf_init((char *)0x0,0);
      local_f8 = uVar5.base;
      _count = local_f8;
      local_f0 = (char *)uVar5.len;
      buf.base = local_f0;
      (*handle->alloc_cb)((uv_handle_t *)handle,0x10000,(uv_buf_t *)&count);
      if ((_count == (char *)0x0) || (buf.base == (char *)0x0)) {
        (*handle->recv_cb)(handle,-0x69,(uv_buf_t *)&count,(sockaddr *)0x0,0);
        return;
      }
      if (_count == (char *)0x0) {
        __assert_fail("buf.base != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/udp.c"
                      ,0xeb,"void uv__udp_recvmsg(uv_udp_t *)");
      }
      iVar2 = uv_udp_using_recvmmsg(handle);
      if (iVar2 == 0) {
        memset(&nread,0,0x38);
        memset(&h.msg_flags,0,0x80);
        nread = (ssize_t)&h.msg_flags;
        h.msg_name._0_4_ = 0x80;
        h._8_8_ = &count;
        h.msg_iov = (iovec *)0x1;
        do {
          buf.len = recvmsg((handle->io_watcher).fd,(msghdr *)&nread,0);
          bVar4 = false;
          if (buf.len == 0xffffffffffffffff) {
            piVar3 = __errno_location();
            bVar4 = *piVar3 == 4;
          }
        } while (bVar4);
        if (buf.len == 0xffffffffffffffff) {
          piVar3 = __errno_location();
          if ((*piVar3 == 0xb) || (piVar3 = __errno_location(), *piVar3 == 0xb)) {
            (*handle->recv_cb)(handle,0,(uv_buf_t *)&count,(sockaddr *)0x0,0);
          }
          else {
            p_Var1 = handle->recv_cb;
            piVar3 = __errno_location();
            (*p_Var1)(handle,(long)-*piVar3,(uv_buf_t *)&count,(sockaddr *)0x0,0);
          }
        }
        else {
          local_e4 = 0;
          if (((uint)h.msg_controllen & 0x20) != 0) {
            local_e4 = 2;
          }
          (*handle->recv_cb)(handle,buf.len,(uv_buf_t *)&count,(sockaddr *)&h.msg_flags,local_e4);
        }
        local_e8 = local_e8 + -1;
      }
      else {
        iVar2 = uv__udp_recvmmsg(handle,(uv_buf_t *)&count);
        buf.len = (size_t)iVar2;
        if (0 < (long)buf.len) {
          local_e8 = local_e8 - iVar2;
        }
      }
      bVar4 = false;
      if (((buf.len != 0xffffffffffffffff) && (bVar4 = false, 0 < local_e8)) &&
         (bVar4 = false, (handle->io_watcher).fd != -1)) {
        bVar4 = handle->recv_cb != (uv_udp_recv_cb)0x0;
      }
    } while (bVar4);
    return;
  }
  __assert_fail("handle->alloc_cb != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/udp.c"
                ,0xdd,"void uv__udp_recvmsg(uv_udp_t *)");
}

Assistant:

static void uv__udp_recvmsg(uv_udp_t* handle) {
  struct sockaddr_storage peer;
  struct msghdr h;
  ssize_t nread;
  uv_buf_t buf;
  int flags;
  int count;

  assert(handle->recv_cb != NULL);
  assert(handle->alloc_cb != NULL);

  /* Prevent loop starvation when the data comes in as fast as (or faster than)
   * we can read it. XXX Need to rearm fd if we switch to edge-triggered I/O.
   */
  count = 32;

  do {
    buf = uv_buf_init(NULL, 0);
    handle->alloc_cb((uv_handle_t*) handle, UV__UDP_DGRAM_MAXSIZE, &buf);
    if (buf.base == NULL || buf.len == 0) {
      handle->recv_cb(handle, UV_ENOBUFS, &buf, NULL, 0);
      return;
    }
    assert(buf.base != NULL);

    if (uv_udp_using_recvmmsg(handle)) {
      nread = uv__udp_recvmmsg(handle, &buf);
      if (nread > 0)
        count -= nread;
      continue;
    }

    memset(&h, 0, sizeof(h));
    memset(&peer, 0, sizeof(peer));
    h.msg_name = &peer;
    h.msg_namelen = sizeof(peer);
    h.msg_iov = (void*) &buf;
    h.msg_iovlen = 1;

    do {
      nread = recvmsg(handle->io_watcher.fd, &h, 0);
    }
    while (nread == -1 && errno == EINTR);

    if (nread == -1) {
      if (errno == EAGAIN || errno == EWOULDBLOCK)
        handle->recv_cb(handle, 0, &buf, NULL, 0);
      else
        handle->recv_cb(handle, UV__ERR(errno), &buf, NULL, 0);
    }
    else {
      flags = 0;
      if (h.msg_flags & MSG_TRUNC)
        flags |= UV_UDP_PARTIAL;

      handle->recv_cb(handle, nread, &buf, (const struct sockaddr*) &peer, flags);
    }
    count--;
  }
  /* recv_cb callback may decide to pause or close the handle */
  while (nread != -1
      && count > 0
      && handle->io_watcher.fd != -1
      && handle->recv_cb != NULL);
}